

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::ImmediatePromiseNodeBase::~ImmediatePromiseNodeBase(ImmediatePromiseNodeBase *this)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + -0x28) == 0) {
    return;
  }
  AsyncObject::failed();
}

Assistant:

AsyncObject::~AsyncObject() {
  if (disallowAsyncDestructorsScope != nullptr) {
    // If we try to do the KJ_FAIL_REQUIRE here (declaring `~AsyncObject()` itself to be noexcept),
    // it seems to have a non-negligible performance impact in the HTTP benchmark. My guess is that
    // it's because it breaks inlining of `~AsyncObject()` into various subclass destructors that
    // are defined inside this file, which are some of the biggest ones. By forcing the actual
    // failure code out into a separate function we get a little performance boost.
    failed();
  }
}